

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O1

i32_t Kumu::base64decode(char *str,byte_t *buf,ui32_t buf_len,ui32_t *char_count)

{
  char cVar1;
  byte bVar2;
  i32_t iVar3;
  int iVar4;
  ulong uVar5;
  ui32_t uVar6;
  byte bVar7;
  int iVar8;
  
  iVar3 = -1;
  if (char_count != (ui32_t *)0x0 && (buf != (byte_t *)0x0 && str != (char *)0x0)) {
    iVar3 = 0;
    uVar6 = 0;
    if (buf_len != 0) {
      uVar6 = 0;
      bVar7 = 0;
      iVar8 = 0;
      do {
        do {
          cVar1 = *str;
          if ((long)cVar1 == 0) goto LAB_00117e1e;
          str = str + 1;
          bVar2 = decode_map[cVar1];
        } while (bVar2 == 0xff);
        if (cVar1 == '=') break;
        iVar4 = iVar8 + 1;
        switch(iVar8) {
        case 0:
          uVar5 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          buf[uVar5] = bVar2 << 2;
          break;
        case 1:
          buf[uVar6 - 1] = buf[uVar6 - 1] | bVar2 >> 4;
          bVar7 = bVar2;
          break;
        case 2:
          uVar5 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          buf[uVar5] = bVar2 >> 2 | bVar7 << 4;
          bVar7 = bVar2;
          break;
        case 3:
          uVar5 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          buf[uVar5] = bVar2 | bVar7 << 6;
          iVar4 = 0;
        }
        iVar8 = iVar4;
      } while (uVar6 < buf_len);
    }
LAB_00117e1e:
    *char_count = uVar6;
  }
  return iVar3;
}

Assistant:

i32_t
Kumu::base64decode(const char* str, byte_t* buf, ui32_t buf_len, ui32_t* char_count)
{
  byte_t c = 0, d = 0;
  ui32_t phase = 0, i = 0;

  if ( str == 0 || buf == 0 || char_count == 0 )
    return -1;

  while ( *str != 0 && i < buf_len )
    {
      c = decode_map[(int)*str++];
      if ( c == 0xff ) continue;
      if ( c == 0xfe ) break;

      switch ( phase++ )
	{
	case 0:
	  buf[i++] =  c << 2;
	  break;

	case 1:
	  buf[i - 1] |= c >> 4;
	  d = c;
	  break;

	case 2:
	  buf[i++] =  ( d << 4 ) | ( c >> 2 );
	  d = c;
	  break;

	case 3:
	  buf[i++] =  ( d << 6 ) | c;
	  phase = 0;
	  break;
	}
    }

  *char_count = i;
  return 0;
}